

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

int yy_prefix(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int yypos0;
  code *action;
  char *name;
  int yythunkpos0;
  
  iVar3 = G->pos;
  iVar2 = G->thunkpos;
  iVar1 = yy_AND(G);
  if ((iVar1 == 0) || (iVar1 = yy_action(G), iVar1 == 0)) {
    G->pos = iVar3;
    G->thunkpos = iVar2;
    iVar1 = yy_AND(G);
    if ((iVar1 == 0) || (iVar1 = yy_suffix(G), iVar1 == 0)) {
      G->pos = iVar3;
      G->thunkpos = iVar2;
      iVar1 = yymatchChar(G,0x21);
      if (iVar1 != 0) {
        yy__(G);
        iVar1 = yy_suffix(G);
        if (iVar1 != 0) {
          iVar3 = G->begin;
          iVar2 = G->end;
          action = yy_3_prefix;
          name = "yy_3_prefix";
          goto LAB_001032d8;
        }
      }
      G->pos = iVar3;
      G->thunkpos = iVar2;
      iVar1 = yy_suffix(G);
      if (iVar1 != 0) {
        return 1;
      }
      G->pos = iVar3;
      G->thunkpos = iVar2;
      return 0;
    }
    iVar3 = G->begin;
    iVar2 = G->end;
    action = yy_2_prefix;
    name = "yy_2_prefix";
  }
  else {
    iVar3 = G->begin;
    iVar2 = G->end;
    action = yy_1_prefix;
    name = "yy_1_prefix";
  }
LAB_001032d8:
  yyDo(G,action,iVar3,iVar2,name);
  return 1;
}

Assistant:

YY_RULE(int) yy_prefix(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "prefix"));

  {  int yypos82= G->pos, yythunkpos82= G->thunkpos;  if (!yy_AND(G))  goto l83;
  if (!yy_action(G))  goto l83;
  yyDo(G, yy_1_prefix, G->begin, G->end, "yy_1_prefix");
  goto l82;
  l83:;	  G->pos= yypos82; G->thunkpos= yythunkpos82;  if (!yy_AND(G))  goto l84;
  if (!yy_suffix(G))  goto l84;
  yyDo(G, yy_2_prefix, G->begin, G->end, "yy_2_prefix");
  goto l82;
  l84:;	  G->pos= yypos82; G->thunkpos= yythunkpos82;  if (!yy_NOT(G))  goto l85;
  if (!yy_suffix(G))  goto l85;
  yyDo(G, yy_3_prefix, G->begin, G->end, "yy_3_prefix");
  goto l82;
  l85:;	  G->pos= yypos82; G->thunkpos= yythunkpos82;  if (!yy_suffix(G))  goto l81;

  }
  l82:;	  yyprintf((stderr, "  ok   prefix"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l81:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "prefix"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}